

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall
Highs::addCol(Highs *this,double cost,double lower_bound,double upper_bound,HighsInt num_new_nz,
             HighsInt *indices,double *values)

{
  HighsStatus HVar1;
  double upper_bound_local;
  double lower_bound_local;
  double cost_local;
  HighsInt starts;
  
  upper_bound_local = upper_bound;
  lower_bound_local = lower_bound;
  cost_local = cost;
  if ((this->written_log_header_ == false) &&
     (*(this->options_).super_HighsOptionsStruct.log_options.output_flag == true)) {
    highsLogHeader(&(this->options_).super_HighsOptionsStruct.log_options,
                   (this->options_).super_HighsOptionsStruct.log_githash);
    this->written_log_header_ = true;
  }
  starts = 0;
  HVar1 = addCols(this,1,&cost_local,&lower_bound_local,&upper_bound_local,num_new_nz,&starts,
                  indices,values);
  return HVar1;
}

Assistant:

HighsStatus Highs::addCol(const double cost, const double lower_bound,
                          const double upper_bound, const HighsInt num_new_nz,
                          const HighsInt* indices, const double* values) {
  this->logHeader();
  HighsInt starts = 0;
  return addCols(1, &cost, &lower_bound, &upper_bound, num_new_nz, &starts,
                 indices, values);
}